

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O2

Aig_Obj_t * Saig_ManAbstractionDfs_rec(Aig_Man_t *pNew,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  
  if ((Aig_Obj_t *)(pObj->field_5).pData != (Aig_Obj_t *)0x0) {
    return (Aig_Obj_t *)(pObj->field_5).pData;
  }
  Saig_ManAbstractionDfs_rec(pNew,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
  Saig_ManAbstractionDfs_rec(pNew,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  pAVar1 = Aig_ObjChild0Copy(pObj);
  p1 = Aig_ObjChild1Copy(pObj);
  pAVar1 = Aig_And(pNew,pAVar1,p1);
  (pObj->field_5).pData = pAVar1;
  return pAVar1;
}

Assistant:

Aig_Obj_t * Saig_ManAbstractionDfs_rec( Aig_Man_t * pNew, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    Saig_ManAbstractionDfs_rec( pNew, Aig_ObjFanin0(pObj) );
    Saig_ManAbstractionDfs_rec( pNew, Aig_ObjFanin1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ));
}